

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaGig.c
# Opt level: O3

void Gia_ManPrintDelays(Vec_Int_t *vObjs,Vec_Int_t *vStore)

{
  uint *puVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  uint uVar5;
  void *__s;
  long lVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  
  iVar2 = vObjs->nSize;
  uVar9 = (ulong)iVar2;
  uVar10 = (uint)(uVar9 + 100);
  uVar5 = 0x10;
  if (0xe < iVar2 + 99U) {
    uVar5 = uVar10;
  }
  if (uVar5 == 0) {
    __s = (void *)0x0;
  }
  else {
    __s = malloc((long)(int)uVar5 << 2);
  }
  memset(__s,0,(uVar9 + 100) * 4);
  if (0 < iVar2) {
    piVar3 = vObjs->pArray;
    uVar7 = 0;
    do {
      lVar8 = (long)piVar3[uVar7];
      if ((lVar8 < 0) || (vStore->nSize <= piVar3[uVar7])) goto LAB_006b5417;
      piVar4 = vStore->pArray;
      if (piVar4[lVar8 + 1] == 8) {
        if (piVar4[lVar8 + 2] != 1) {
          __assert_fail("pEntry[2] == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaGig.c"
                        ,0x71,"void Gia_ManPrintDelays(Vec_Int_t *, Vec_Int_t *)");
        }
        if (uVar10 <= (uint)piVar4[lVar8 + 3]) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x1d1,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
        }
        piVar4 = (int *)((long)__s + (ulong)(uint)piVar4[lVar8 + 3] * 4);
        *piVar4 = *piVar4 + 1;
      }
      uVar7 = uVar7 + 1;
    } while (uVar9 != uVar7);
    if (0 < iVar2) {
      lVar8 = 0;
      do {
        lVar6 = (long)vObjs->pArray[lVar8];
        if ((lVar6 < 0) || (vStore->nSize <= vObjs->pArray[lVar8])) {
LAB_006b5417:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x1af,"int *Vec_IntEntryP(Vec_Int_t *, int)");
        }
        if (vStore->pArray[lVar6 + 1] == 6) {
          puVar1 = (uint *)(vStore->pArray + lVar6);
          if (uVar10 <= *puVar1) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                          ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          printf("(%d,%d,%d)  ",(long)(int)puVar1[2],
                 (ulong)*(uint *)((long)__s + (ulong)*puVar1 * 4),
                 (ulong)puVar1[(long)(int)puVar1[2] + 3]);
          uVar9 = (ulong)(uint)vObjs->nSize;
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < (int)uVar9);
    }
  }
  putchar(10);
  if (__s != (void *)0x0) {
    free(__s);
    return;
  }
  return;
}

Assistant:

void Gia_ManPrintDelays( Vec_Int_t * vObjs, Vec_Int_t * vStore )
{
    Vec_Int_t * vFanCount = Vec_IntStart( Vec_IntSize(vObjs) + 100 );
    int i, * pEntry;//, Counter = 0;
    for ( i = 0; i < Vec_IntSize(vObjs); i++ )
    {
        pEntry = Vec_IntEntryP( vStore, Vec_IntEntry(vObjs,i) );
        if ( pEntry[1] != GIG_SEL )
            continue;
        assert( pEntry[2] == 1 );
        Vec_IntAddToEntry( vFanCount, pEntry[3], 1 );
    }
    for ( i = 0; i < Vec_IntSize(vObjs); i++ )
    {
        pEntry = Vec_IntEntryP( vStore, Vec_IntEntry(vObjs,i) );
        if ( pEntry[1] != GIG_DELAY )
            continue;
        printf( "(%d,%d,%d)  ", pEntry[2], Vec_IntEntry(vFanCount, pEntry[0]), pEntry[3+pEntry[2]] );
    }
    printf( "\n" );
    Vec_IntFree( vFanCount );
}